

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O1

void __thiscall
mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
IndicatorConstraint(IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                    *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                          *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  
  paVar1 = &(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->super_BasicConstraint).name_._M_dataplus._M_p;
  paVar2 = &(param_1->super_BasicConstraint).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->super_BasicConstraint).name_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_BasicConstraint).name_.field_2 + 8) = uVar4;
  }
  else {
    (this->super_BasicConstraint).name_._M_dataplus._M_p = pcVar3;
    (this->super_BasicConstraint).name_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->super_BasicConstraint).name_._M_string_length =
       (param_1->super_BasicConstraint).name_._M_string_length;
  (param_1->super_BasicConstraint).name_._M_dataplus._M_p = (pointer)paVar2;
  (param_1->super_BasicConstraint).name_._M_string_length = 0;
  (param_1->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  iVar5 = param_1->bv_;
  this->b_ = param_1->b_;
  this->bv_ = iVar5;
  (this->con_).super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&(this->con_).super_BasicConstraint.name_.field_2;
  pcVar3 = (param_1->con_).super_BasicConstraint.name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->con_,pcVar3,
             pcVar3 + (param_1->con_).super_BasicConstraint.name_._M_string_length);
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)&(this->con_).super_LinTerms,
             &(param_1->con_).super_LinTerms);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&(this->con_).super_LinTerms.vars_,
             &(param_1->con_).super_LinTerms.vars_);
  (this->con_).super_AlgConRhs<_1>.rhs_ = (param_1->con_).super_AlgConRhs<_1>.rhs_;
  return;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
        { std::string("IndicatorConstraint[") + Con::GetTypeName() + ']' };
    return name.c_str();
  }